

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O2

void __thiscall
Js::ProbeContainer::DispatchStepHandler
          (ProbeContainer *this,InterpreterHaltState *pHaltState,OpCode *pOriginalOpcode)

{
  OpCode OVar1;
  bool bVar2;
  int offset;
  FunctionBody *pFVar3;
  ProbeContainer *local_48;
  FinallyObject local_40;
  
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::DispatchStepHandler: start: this=%p, pHaltState=%p, pOriginalOpcode=0x%x\n"
                ,this,pHaltState,pOriginalOpcode);
  bVar2 = CanDispatchHalt(this,pHaltState);
  if (bVar2) {
    local_40.finallyFunc = (anon_class_48_6_9e8417c9 *)&local_48;
    local_40.abnormalTermination = true;
    local_48 = this;
    InitializeLocation(this,pHaltState,true);
    bVar2 = InterpreterHaltState::IsValid(pHaltState);
    Output::Trace(DebuggerPhase,
                  L"ProbeContainer::DispatchStepHandler: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"
                  ,pHaltState,(ulong)bVar2);
    bVar2 = InterpreterHaltState::IsValid(pHaltState);
    if (bVar2) {
      bVar2 = StepController::IsStepComplete
                        (&this->debugManager->stepController,pHaltState,this->haltCallbackProbe,
                         *pOriginalOpcode);
      if (bVar2) {
        OVar1 = *pOriginalOpcode;
        pFVar3 = InterpreterHaltState::GetFunction(pHaltState);
        offset = InterpreterHaltState::GetCurrentOffset(pHaltState);
        FunctionBody::ProbeAtOffset(pFVar3,offset,pOriginalOpcode);
        pFVar3 = InterpreterHaltState::GetFunction(pHaltState);
        FunctionBody::CheckAndRegisterFuncToDiag(pFVar3,this->pScriptContext);
        StepController::Deactivate(&this->debugManager->stepController,pHaltState);
        (*this->haltCallbackProbe->_vptr_HaltCallback[1])(this->haltCallbackProbe,pHaltState);
        if ((OVar1 == Break) && ((this->debugManager->stepController).stepType == STEP_DOCUMENT)) {
          *pOriginalOpcode = Break;
        }
        else if (*pOriginalOpcode == Break) {
          (this->debugManager->stepController).stepCompleteOnInlineBreakpoint = true;
        }
      }
    }
    local_40.abnormalTermination = false;
    anon_func::FinallyObject::~FinallyObject(&local_40);
    Output::Trace(DebuggerPhase,L"ProbeContainer::DispatchStepHandler: end: pHaltState=%p\n",
                  pHaltState);
  }
  return;
}

Assistant:

void ProbeContainer::DispatchStepHandler(InterpreterHaltState* pHaltState, OpCode* pOriginalOpcode)
    {
        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchStepHandler: start: this=%p, pHaltState=%p, pOriginalOpcode=0x%x\n"), this, pHaltState, pOriginalOpcode);

        if (!CanDispatchHalt(pHaltState))
        {
            return;
        }

        TryFinally([&]()
          {
            InitializeLocation(pHaltState);
            OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchStepHandler: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"),
                pHaltState, pHaltState->IsValid());

            if (pHaltState->IsValid()) // Only proceed if we find a valid top frame and that is the executing function
            {
                if (debugManager->stepController.IsStepComplete(pHaltState, haltCallbackProbe, *pOriginalOpcode))
                {
                    OpCode oldOpcode = *pOriginalOpcode;
                    pHaltState->GetFunction()->ProbeAtOffset(pHaltState->GetCurrentOffset(), pOriginalOpcode);
                    pHaltState->GetFunction()->CheckAndRegisterFuncToDiag(pScriptContext);

                    debugManager->stepController.Deactivate(pHaltState);
                    haltCallbackProbe->DispatchHalt(pHaltState);

                    if (oldOpcode == OpCode::Break && debugManager->stepController.stepType == STEP_DOCUMENT)
                    {
                        // That means we have delivered the stepping to the debugger, where we had the breakpoint
                        // already, however it is possible that debugger can initiate the step_document. In that
                        // case debugger did not break due to break. So we have break as a breakpoint reason.
                        *pOriginalOpcode = OpCode::Break;
                    }
                    else if (OpCode::Break == *pOriginalOpcode)
                    {
                        debugManager->stepController.stepCompleteOnInlineBreakpoint = true;
                    }
                }
            }
          },
          [&](bool)
          {
            DestroyLocation();
          });

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchStepHandler: end: pHaltState=%p\n"), pHaltState);
    }